

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_span_queue_delete(mi_span_queue_t *sq,mi_slice_t *slice)

{
  mi_slice_t *slice_local;
  mi_span_queue_t *sq_local;
  
  if (slice->prev != (mi_page_s *)0x0) {
    slice->prev->next = slice->next;
  }
  if (slice == sq->first) {
    sq->first = slice->next;
  }
  if (slice->next != (mi_page_s *)0x0) {
    slice->next->prev = slice->prev;
  }
  if (slice == sq->last) {
    sq->last = slice->prev;
  }
  slice->prev = (mi_page_s *)0x0;
  slice->next = (mi_page_s *)0x0;
  slice->block_size = 1;
  return;
}

Assistant:

static void mi_span_queue_delete(mi_span_queue_t* sq, mi_slice_t* slice) {
  mi_assert_internal(slice->block_size==0 && slice->slice_count>0 && slice->slice_offset==0);
  // should work too if the queue does not contain slice (which can happen during reclaim)
  if (slice->prev != NULL) slice->prev->next = slice->next;
  if (slice == sq->first) sq->first = slice->next;
  if (slice->next != NULL) slice->next->prev = slice->prev;
  if (slice == sq->last) sq->last = slice->prev;
  slice->prev = NULL;
  slice->next = NULL;
  slice->block_size = 1; // no more free
}